

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O3

vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> * __thiscall
neueda::cdr::findAll
          (vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>
           *__return_storage_ptr__,cdr *this,cdrKey_t *key)

{
  (__return_storage_ptr__->
  super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  findInChildren(this,&this->mOrdered,key,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<const cdrItem*>
cdr::findAll (const cdrKey_t& key) const
{
    vector<const cdrItem*> found;
    findInChildren (&mOrdered, key, found);
    return found;
}